

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O3

bool __thiscall
cmCTestCoverageHandler::StartCoverageLogFile
          (cmCTestCoverageHandler *this,cmGeneratedFileStream *covLogFile,int logFileCount)

{
  cmCTest *pcVar1;
  bool bVar2;
  size_t sVar3;
  undefined4 in_register_00000014;
  ostringstream cmCTestLog_msg;
  char covLogFilename [1024];
  long *local_5c0;
  long local_5b0 [2];
  undefined1 local_5a0 [376];
  char local_428 [1024];
  
  sprintf(local_428,"CoverageLog-%d",CONCAT44(in_register_00000014,logFileCount));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5a0,"Open file: ",0xb);
  sVar3 = strlen(local_428);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5a0,local_428,sVar3);
  std::ios::widen((char)(ostream *)local_5a0 + (char)*(_func_int **)(local_5a0._0_8_ + -0x18));
  std::ostream::put((char)local_5a0);
  std::ostream::flush();
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,4,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0x99,(char *)local_5c0,(this->super_cmCTestGenericHandler).Quiet);
  if (local_5c0 != local_5b0) {
    operator_delete(local_5c0,local_5b0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a0);
  std::ios_base::~ios_base((ios_base *)(local_5a0 + 0x70));
  bVar2 = cmCTestGenericHandler::StartResultingXML
                    (&this->super_cmCTestGenericHandler,PartCoverage,local_428,covLogFile);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5a0,"Cannot open log file: ",0x16);
    sVar3 = strlen(local_428);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5a0,local_428,sVar3);
    std::ios::widen((char)(ostream *)local_5a0 + (char)*(_func_int **)(local_5a0._0_8_ + -0x18));
    std::ostream::put((char)local_5a0);
    std::ostream::flush();
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,6,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x9d,(char *)local_5c0,false);
    if (local_5c0 != local_5b0) {
      operator_delete(local_5c0,local_5b0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a0);
    std::ios_base::~ios_base((ios_base *)(local_5a0 + 0x70));
  }
  return bVar2;
}

Assistant:

bool cmCTestCoverageHandler::StartCoverageLogFile(
  cmGeneratedFileStream& covLogFile, int logFileCount)
{
  char covLogFilename[1024];
  sprintf(covLogFilename, "CoverageLog-%d", logFileCount);
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Open file: " << covLogFilename << std::endl,
                     this->Quiet);
  if (!this->StartResultingXML(cmCTest::PartCoverage, covLogFilename,
                               covLogFile)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot open log file: " << covLogFilename << std::endl);
    return false;
  }
  return true;
}